

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O1

sljit_sw do_search_mark(sljit_sw *current,PCRE2_SPTR16 skip_arg)

{
  int iVar1;
  
  if (current != (sljit_sw *)0x0) {
    do {
      if ((current[1] == 0) &&
         (iVar1 = _pcre2_strcmp_16(skip_arg,(PCRE2_SPTR16)current[2]), iVar1 == 0)) {
        return current[3];
      }
      current = (sljit_sw *)*current;
    } while (current != (sljit_sw *)0x0);
  }
  return 0;
}

Assistant:

static sljit_sw SLJIT_FUNC do_search_mark(sljit_sw *current, PCRE2_SPTR skip_arg)
{
while (current != NULL)
  {
  switch (current[1])
    {
    case type_then_trap:
    break;

    case type_mark:
    if (PRIV(strcmp)(skip_arg, (PCRE2_SPTR)current[2]) == 0)
      return current[3];
    break;

    default:
    SLJIT_UNREACHABLE();
    break;
    }
  SLJIT_ASSERT(current[0] == 0 || current < (sljit_sw*)current[0]);
  current = (sljit_sw*)current[0];
  }
return 0;
}